

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2contains_point_query.h
# Opt level: O3

bool __thiscall
S2ContainsPointQuery<S2ShapeIndex>::VisitIncidentEdges
          (S2ContainsPointQuery<S2ShapeIndex> *this,S2Point *p,EdgeVisitor *visitor)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  uint uVar4;
  int32 iVar5;
  bool bVar6;
  int iVar7;
  compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *this_00;
  const_reference pvVar8;
  undefined4 extraout_var;
  anon_union_8_2_2d159a09_for_S2ClippedShape_3 *paVar10;
  long lVar11;
  ulong uVar12;
  size_type_conflict n;
  Edge edge;
  VType local_98 [6];
  ShapeEdge local_68;
  long *plVar9;
  
  bVar6 = S2ShapeIndex::Iterator::Locate(&this->it_,p);
  if (bVar6) {
    this_00 = (compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *)
              S2ShapeIndex::Iterator::cell(&this->it_);
    uVar3 = *(uint *)this_00;
    if ((uVar3 & 0xffffff) != 0) {
      n = 0;
      do {
        pvVar8 = gtl::compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>::
                 operator[](this_00,n);
        uVar4 = *(uint *)&pvVar8->field_0x4;
        if (1 < uVar4) {
          iVar7 = (*this->index_->_vptr_S2ShapeIndex[3])
                            (this->index_,(ulong)(uint)pvVar8->shape_id_);
          plVar9 = (long *)CONCAT44(extraout_var,iVar7);
          uVar12 = 0;
          do {
            paVar10 = &pvVar8->field_3;
            if (5 < *(uint *)&pvVar8->field_0x4) {
              paVar10 = (anon_union_8_2_2d159a09_for_S2ClippedShape_3 *)(pvVar8->field_3).edges_;
            }
            iVar5 = *(int32 *)((long)paVar10 + uVar12 * 4);
            (**(code **)(*plVar9 + 0x18))(local_98,plVar9,iVar5);
            lVar11 = 0;
            do {
              dVar1 = *(double *)((long)local_98 + lVar11);
              dVar2 = *(double *)((long)p->c_ + lVar11);
              if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
              bVar6 = lVar11 != 0x10;
              lVar11 = lVar11 + 8;
            } while (bVar6);
            if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
              lVar11 = 0;
              do {
                dVar1 = *(double *)((long)local_98 + lVar11 + 0x18);
                dVar2 = *(double *)((long)p->c_ + lVar11);
                if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
                bVar6 = lVar11 != 0x10;
                lVar11 = lVar11 + 8;
              } while (bVar6);
              if ((dVar1 == dVar2) && (!NAN(dVar1) && !NAN(dVar2))) goto LAB_001a3376;
            }
            else {
LAB_001a3376:
              local_68.id_.shape_id = (int32)plVar9[1];
              local_68.edge_.v1.c_[1] = local_98[4];
              local_68.edge_.v1.c_[2] = local_98[5];
              local_68.edge_.v0.c_[2] = local_98[2];
              local_68.edge_.v1.c_[0] = local_98[3];
              local_68.edge_.v0.c_[0] = local_98[0];
              local_68.edge_.v0.c_[1] = local_98[1];
              local_68.id_.edge_id = iVar5;
              if ((visitor->super__Function_base)._M_manager == (_Manager_type)0x0) {
                std::__throw_bad_function_call();
              }
              bVar6 = (*visitor->_M_invoker)((_Any_data *)visitor,&local_68);
              if (!bVar6) {
                return false;
              }
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 != uVar4 >> 1);
        }
        n = n + 1;
      } while (n != (uVar3 & 0xffffff));
    }
  }
  return true;
}

Assistant:

bool S2ContainsPointQuery<IndexType>::VisitIncidentEdges(
    const S2Point& p, const EdgeVisitor& visitor) {
  // This function returns "false" only if the algorithm terminates early
  // because the "visitor" function returned false.
  if (!it_.Locate(p)) return true;

  const S2ShapeIndexCell& cell = it_.cell();
  int num_clipped = cell.num_clipped();
  for (int s = 0; s < num_clipped; ++s) {
    const S2ClippedShape& clipped = cell.clipped(s);
    int num_edges = clipped.num_edges();
    if (num_edges == 0) continue;
    const S2Shape& shape = *index_->shape(clipped.shape_id());
    for (int i = 0; i < num_edges; ++i) {
      int edge_id = clipped.edge(i);
      auto edge = shape.edge(edge_id);
      if ((edge.v0 == p || edge.v1 == p) &&
          !visitor(s2shapeutil::ShapeEdge(shape.id(), edge_id, edge))) {
        return false;
      }
    }
  }
  return true;
}